

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

iterator __thiscall
cs::tree_type<cs::token_base*>::emplace_left_left<cs::token_id*>
          (tree_type<cs::token_base*> *this,iterator it,token_id **args)

{
  tree_node *ptVar1;
  iterator iVar2;
  error *this_00;
  string local_38;
  
  if (it.mData != (tree_node *)0x0) {
    iVar2.mData = (tree_node *)operator_new(0x20);
    ptVar1 = (it.mData)->left;
    (iVar2.mData)->root = it.mData;
    (iVar2.mData)->left = ptVar1;
    (iVar2.mData)->right = (tree_node *)0x0;
    (iVar2.mData)->data = &(*args)->super_token_base;
    if (ptVar1 != (tree_node *)0x0) {
      ptVar1->root = iVar2.mData;
    }
    (it.mData)->left = iVar2.mData;
    return (iterator)iVar2.mData;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000E","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool usable() const noexcept
			{
				return this->mData != nullptr;
			}